

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetSysFunc(void *kinmem,KINSysFn func)

{
  KINMem kin_mem;
  KINSysFn func_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetSysFunc","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else if (func == (KINSysFn)0x0) {
    KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetSysFunc","func = NULL illegal.");
    kinmem_local._4_4_ = -2;
  }
  else {
    *(KINSysFn *)((long)kinmem + 8) = func;
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetSysFunc(void *kinmem, KINSysFn func)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetSysFunc", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (func == NULL) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetSysFunc", MSG_FUNC_NULL);
    return(KIN_ILL_INPUT);
  }

  kin_mem->kin_func = func;

  return(KIN_SUCCESS);
}